

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

char * build_ustar_entry_name(char *dest,char *src,size_t src_length,char *insert)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  bool local_49;
  
  if (insert == (char *)0x0) {
    if (src_length < 100 && insert == (char *)0x0) {
      strncpy(dest,src,src_length);
      pcVar6 = dest + src_length;
      goto LAB_0047862a;
    }
    lVar4 = 0;
  }
  else {
    sVar3 = strlen(insert);
    lVar4 = sVar3 + 2;
  }
  pcVar6 = src + src_length;
  bVar1 = (long)src_length < 1;
  if ((long)src_length < 1) {
    uVar11 = 99;
  }
  else {
    local_49 = true;
    do {
      if (src[src_length - 1] == '/') {
        src_length = src_length - 1;
      }
      else {
        if (((src_length == 1) || (pcVar6[-1] != '.')) || (src[src_length - 2] != '/')) {
          uVar11 = (ulong)local_49 | 0x62;
          pcVar8 = src + (src_length - 1);
          if (src_length < 2) {
            bVar13 = false;
            lVar7 = 0;
            goto LAB_00478505;
          }
          bVar13 = *pcVar8 != '/';
          if (!bVar13) {
            lVar7 = src_length - 1;
            goto LAB_00478505;
          }
          lVar9 = src_length - 1;
          goto LAB_004784b7;
        }
        src_length = src_length - 2;
      }
      pcVar6 = src + src_length;
      local_49 = false;
    } while (0 < (long)src_length);
    uVar11 = 0x62;
  }
  lVar7 = src_length - 1;
  bVar13 = false;
  pcVar8 = src + (src_length - 1);
  local_49 = bVar1;
  goto LAB_00478505;
  while (lVar2 = lVar9 + -1, lVar9 = lVar7, src[lVar2] != '/') {
LAB_004784b7:
    lVar7 = lVar9 + -1;
    if (lVar7 < 1) {
      lVar7 = 0;
      pcVar8 = src;
      goto LAB_00478505;
    }
  }
  pcVar8 = src + lVar7;
LAB_00478505:
  lVar7 = (ulong)(byte)(*pcVar8 == '/' & bVar13) + lVar7;
  pcVar8 = src + lVar7;
  if (pcVar8 + (uVar11 - lVar4) < pcVar6) {
    pcVar6 = pcVar8 + (uVar11 - lVar4);
  }
  sVar3 = (long)pcVar6 - (long)pcVar8;
  pcVar6 = src + 0x9b;
  pcVar10 = src + 0x9b;
  if (lVar7 < 0x9b) {
    pcVar6 = pcVar8;
    pcVar10 = pcVar8;
  }
  for (; (src < pcVar6 && (pcVar10 = pcVar6, *pcVar6 != '/')); pcVar6 = pcVar6 + -1) {
    pcVar10 = src;
  }
  if (pcVar10 < pcVar8) {
    pcVar10 = pcVar10 + (*pcVar10 == '/');
  }
  pcVar12 = pcVar10 + ((uVar11 - lVar4) - sVar3);
  if (pcVar8 < pcVar10 + ((uVar11 - lVar4) - sVar3)) {
    pcVar12 = pcVar8;
  }
  if (pcVar12 < pcVar10) {
    pcVar12 = pcVar10;
  }
  for (; (pcVar10 < pcVar12 && (*pcVar12 != '/')); pcVar12 = pcVar12 + -1) {
  }
  if (pcVar12 < pcVar8) {
    pcVar12 = pcVar12 + (*pcVar12 == '/');
  }
  sVar5 = (long)pcVar10 - (long)src;
  pcVar6 = dest;
  if (src <= pcVar10 && sVar5 != 0) {
    strncpy(dest,src,sVar5);
    pcVar6 = dest + sVar5;
  }
  sVar5 = (long)pcVar12 - (long)pcVar10;
  if (pcVar10 <= pcVar12 && sVar5 != 0) {
    strncpy(pcVar6,pcVar10,sVar5);
    pcVar6 = pcVar6 + sVar5;
  }
  if (insert != (char *)0x0) {
    strcpy(pcVar6,insert);
    sVar5 = strlen(insert);
    pcVar10 = pcVar6 + sVar5;
    pcVar6 = pcVar10 + 1;
    *pcVar10 = '/';
  }
  strncpy(pcVar6,pcVar8,sVar3);
  pcVar6 = pcVar6 + sVar3;
  if (local_49 == false) {
    *pcVar6 = '/';
    pcVar6 = pcVar6 + 1;
  }
LAB_0047862a:
  *pcVar6 = '\0';
  return dest;
}

Assistant:

static char *
build_ustar_entry_name(char *dest, const char *src, size_t src_length,
    const char *insert)
{
	const char *prefix, *prefix_end;
	const char *suffix, *suffix_end;
	const char *filename, *filename_end;
	char *p;
	int need_slash = 0; /* Was there a trailing slash? */
	size_t suffix_length = 99;
	size_t insert_length;

	/* Length of additional dir element to be added. */
	if (insert == NULL)
		insert_length = 0;
	else
		/* +2 here allows for '/' before and after the insert. */
		insert_length = strlen(insert) + 2;

	/* Step 0: Quick bailout in a common case. */
	if (src_length < 100 && insert == NULL) {
		strncpy(dest, src, src_length);
		dest[src_length] = '\0';
		return (dest);
	}

	/* Step 1: Locate filename and enforce the length restriction. */
	filename_end = src + src_length;
	/* Remove trailing '/' chars and '/.' pairs. */
	for (;;) {
		if (filename_end > src && filename_end[-1] == '/') {
			filename_end --;
			need_slash = 1; /* Remember to restore trailing '/'. */
			continue;
		}
		if (filename_end > src + 1 && filename_end[-1] == '.'
		    && filename_end[-2] == '/') {
			filename_end -= 2;
			need_slash = 1; /* "foo/." will become "foo/" */
			continue;
		}
		break;
	}
	if (need_slash)
		suffix_length--;
	/* Find start of filename. */
	filename = filename_end - 1;
	while ((filename > src) && (*filename != '/'))
		filename --;
	if ((*filename == '/') && (filename < filename_end - 1))
		filename ++;
	/* Adjust filename_end so that filename + insert fits in 99 chars. */
	suffix_length -= insert_length;
	if (filename_end > filename + suffix_length)
		filename_end = filename + suffix_length;
	/* Calculate max size for "suffix" section (#3 above). */
	suffix_length -= filename_end - filename;

	/* Step 2: Locate the "prefix" section of the dirname, including
	 * trailing '/'. */
	prefix = src;
	prefix_end = prefix + 155;
	if (prefix_end > filename)
		prefix_end = filename;
	while (prefix_end > prefix && *prefix_end != '/')
		prefix_end--;
	if ((prefix_end < filename) && (*prefix_end == '/'))
		prefix_end++;

	/* Step 3: Locate the "suffix" section of the dirname,
	 * including trailing '/'. */
	suffix = prefix_end;
	suffix_end = suffix + suffix_length; /* Enforce limit. */
	if (suffix_end > filename)
		suffix_end = filename;
	if (suffix_end < suffix)
		suffix_end = suffix;
	while (suffix_end > suffix && *suffix_end != '/')
		suffix_end--;
	if ((suffix_end < filename) && (*suffix_end == '/'))
		suffix_end++;

	/* Step 4: Build the new name. */
	/* The OpenBSD strlcpy function is safer, but less portable. */
	/* Rather than maintain two versions, just use the strncpy version. */
	p = dest;
	if (prefix_end > prefix) {
		strncpy(p, prefix, prefix_end - prefix);
		p += prefix_end - prefix;
	}
	if (suffix_end > suffix) {
		strncpy(p, suffix, suffix_end - suffix);
		p += suffix_end - suffix;
	}
	if (insert != NULL) {
		/* Note: assume insert does not have leading or trailing '/' */
		strcpy(p, insert);
		p += strlen(insert);
		*p++ = '/';
	}
	strncpy(p, filename, filename_end - filename);
	p += filename_end - filename;
	if (need_slash)
		*p++ = '/';
	*p = '\0';

	return (dest);
}